

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::~WebSocketResponseImpl
          (WebSocketResponseImpl *this)

{
  WebSocketResponseImpl *this_local;
  
  Promise<void>::~Promise(&this->task);
  Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>_>::~Own(&this->fulfiller);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

WebSocketResponseImpl(kj::Own<kj::PromiseFulfiller<HttpClient::WebSocketResponse>> fulfiller)
        : fulfiller(kj::mv(fulfiller)) {}